

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ethercatdc.c
# Opt level: O2

uint8 ecx_prevport(ecx_contextt *context,uint16 slave,uint8 port)

{
  byte bVar1;
  uint8 pport;
  undefined7 in_register_00000011;
  undefined2 in_register_00000032;
  
  if ((uint)CONCAT71(in_register_00000011,port) < 4) {
    bVar1 = context->slavelist[CONCAT22(in_register_00000032,slave)].activeports;
    switch(CONCAT71(in_register_00000011,port) & 0xffffffff) {
    case 0:
      port = 2;
      if ((bVar1 & 4) == 0) {
        port = bVar1 >> 1 & 1;
      }
      break;
    case 1:
      port = 3;
      if ((bVar1 & 8) == 0) {
        if ((bVar1 & 1) != 0) {
          return '\0';
        }
        return '\x02' - ((bVar1 & 4) == 0);
      }
      break;
    case 2:
      port = 1;
      if (((bVar1 & 2) == 0) && (port = 3, (bVar1 & 8) == 0)) {
        port = ~bVar1 * '\x02' & 2;
      }
      break;
    case 3:
      if ((bVar1 & 1) != 0) {
        return '\0';
      }
      port = 2;
      if ((bVar1 & 4) == 0) {
        return ((bVar1 & 2) == 0) * '\x02' + '\x01';
      }
    }
  }
  return port;
}

Assistant:

static uint8 ecx_prevport(ecx_contextt *context, uint16 slave, uint8 port)
{
   uint8 pport = port;
   uint8 aport = context->slavelist[slave].activeports;
   switch(port)
   {
      case 0:
         if(aport & PORTM2)
            pport = 2;
         else if (aport & PORTM1)
            pport = 1;
         else if (aport & PORTM2)
            pport = 3;
         break;
      case 1:
         if(aport & PORTM3)
            pport = 3;
         else if (aport & PORTM0)
            pport = 0;
         else if (aport & PORTM2)
            pport = 2;
         break;
      case 2:
         if(aport & PORTM1)
            pport = 1;
         else if (aport & PORTM3)
            pport = 3;
         else if (aport & PORTM0)
            pport = 0;
         break;
      case 3:
         if(aport & PORTM0)
            pport = 0;
         else if (aport & PORTM2)
            pport = 2;
         else if (aport & PORTM1)
            pport = 1;
         break;
   }      
   return pport;
}